

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

void AddAttributesToAttrDataList(SstStream Stream,_TimestepMetadataMsg *Msg)

{
  void *pvVar1;
  undefined8 *puVar2;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  _SstBlock *NewInfo;
  int i;
  int local_14;
  
  if (*(int *)(in_RDI + 0x288) != 0) {
    local_14 = 0;
    while( true ) {
      bVar3 = false;
      if (*(long *)(in_RDI + 0x280) != 0) {
        bVar3 = *(long *)(*(long *)(in_RDI + 0x280) + (long)local_14 * 0x10 + 8) != 0;
      }
      if (!bVar3) break;
      free(*(void **)(*(long *)(in_RDI + 0x280) + (long)local_14 * 0x10 + 8));
      local_14 = local_14 + 1;
    }
    free(*(void **)(in_RDI + 0x280));
    *(undefined8 *)(in_RDI + 0x280) = 0;
    *(undefined4 *)(in_RDI + 0x28c) = 0;
    *(undefined4 *)(in_RDI + 0x288) = 0;
  }
  if (**(long **)(in_RSI + 0x28) != 0) {
    pvVar1 = realloc(*(void **)(in_RDI + 0x280),(long)(*(int *)(in_RDI + 0x28c) + 2) << 4);
    *(void **)(in_RDI + 0x280) = pvVar1;
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x280) + (long)*(int *)(in_RDI + 0x28c) * 0x10);
    *(int *)(in_RDI + 0x28c) = *(int *)(in_RDI + 0x28c) + 1;
    pvVar1 = malloc(**(size_t **)(in_RSI + 0x28));
    puVar2[1] = pvVar1;
    *puVar2 = **(undefined8 **)(in_RSI + 0x28);
    memcpy((void *)puVar2[1],*(void **)(*(long *)(in_RSI + 0x28) + 8),**(size_t **)(in_RSI + 0x28));
    memset((void *)(*(long *)(in_RDI + 0x280) + (long)*(int *)(in_RDI + 0x28c) * 0x10),0,0x10);
  }
  return;
}

Assistant:

void AddAttributesToAttrDataList(SstStream Stream, struct _TimestepMetadataMsg *Msg)
{
    if (Stream->AttrsRetrieved)
    {
        int i = 0;
        while (Stream->InternalAttrDataInfo && Stream->InternalAttrDataInfo[i].BlockData)
        {
            free(Stream->InternalAttrDataInfo[i].BlockData);
            i++;
        }
        free(Stream->InternalAttrDataInfo);
        Stream->InternalAttrDataInfo = NULL;
        Stream->InternalAttrDataCount = 0;
        Stream->AttrsRetrieved = 0;
    }
    if (Msg->AttributeData->DataSize == 0)
        return;

    Stream->InternalAttrDataInfo =
        realloc(Stream->InternalAttrDataInfo,
                (sizeof(struct _SstBlock) * (Stream->InternalAttrDataCount + 2)));
    struct _SstBlock *NewInfo = &Stream->InternalAttrDataInfo[Stream->InternalAttrDataCount];
    Stream->InternalAttrDataCount++;
    NewInfo->BlockData = malloc(Msg->AttributeData->DataSize);
    NewInfo->BlockSize = Msg->AttributeData->DataSize;
    memcpy(NewInfo->BlockData, Msg->AttributeData->block, Msg->AttributeData->DataSize);
    memset(&Stream->InternalAttrDataInfo[Stream->InternalAttrDataCount], 0,
           sizeof(struct _SstData));
}